

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

ssize_t __thiscall llvm::raw_ostream::write(raw_ostream *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  char local_19;
  
  pcVar1 = this->OutBufCur;
  if (this->OutBufEnd <= pcVar1) {
    do {
      if (this->OutBufStart != (char *)0x0) {
        flush_nonempty(this);
        pcVar1 = this->OutBufCur;
        break;
      }
      if (this->BufferMode == Unbuffered) {
        local_19 = (char)__fd;
        (*this->_vptr_raw_ostream[8])(this,&local_19,1);
        return (ssize_t)this;
      }
      SetBuffered(this);
      pcVar1 = this->OutBufCur;
    } while (this->OutBufEnd <= pcVar1);
  }
  this->OutBufCur = pcVar1 + 1;
  *pcVar1 = (char)__fd;
  return (ssize_t)this;
}

Assistant:

raw_ostream &raw_ostream::write(unsigned char C) {
  // Group exceptional cases into a single branch.
  if (LLVM_UNLIKELY(OutBufCur >= OutBufEnd)) {
    if (LLVM_UNLIKELY(!OutBufStart)) {
      if (BufferMode == BufferKind::Unbuffered) {
        write_impl(reinterpret_cast<char*>(&C), 1);
        return *this;
      }
      // Set up a buffer and start over.
      SetBuffered();
      return write(C);
    }

    flush_nonempty();
  }

  *OutBufCur++ = C;
  return *this;
}